

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O1

int __thiscall procxx::pipe_streambuf::close(pipe_streambuf *this,int __fd)

{
  int __fd_00;
  pipe_end pVar1;
  pipe_end pVar2;
  
  pipe_ostreambuf::close(&this->super_pipe_ostreambuf,__fd);
  pVar1 = pipe_t::read_end();
  if (pVar1.end_ != __fd) {
    (**(code **)(*(long *)&this->super_pipe_ostreambuf + 0x78))(this);
    pVar2 = pipe_t::write_end();
    __fd_00 = (this->stdin_pipe_).pipe_._M_elems[pVar2.end_];
    pVar1 = pVar2;
    if (__fd_00 != -1) {
      pVar1.end_ = ::close(__fd_00);
      (this->stdin_pipe_).pipe_._M_elems[pVar2.end_] = -1;
    }
  }
  return pVar1.end_;
}

Assistant:

void close(pipe_t::pipe_end end) override {
    pipe_ostreambuf::close(end);
    if (end != pipe_t::read_end()) {
      flush();
      stdin_pipe().close(pipe_t::write_end());
    }
  }